

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTrav.c
# Opt level: O2

void Tim_ManSetCurrentTravIdBoxOutputs(Tim_Man_t *p,int iBox)

{
  Tim_Box_t *pBox;
  Tim_Obj_t *pTVar1;
  int i;
  
  pBox = Tim_ManBox(p,iBox);
  i = 0;
  while( true ) {
    if (pBox->nOutputs <= i) {
      return;
    }
    pTVar1 = Tim_ManBoxOutput(p,pBox,i);
    if (pTVar1 == (Tim_Obj_t *)0x0) break;
    pTVar1->TravId = p->nTravIds;
    i = i + 1;
  }
  return;
}

Assistant:

void Tim_ManSetCurrentTravIdBoxOutputs( Tim_Man_t * p, int iBox )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    int i;
    pBox = Tim_ManBox( p, iBox );
    Tim_ManBoxForEachOutput( p, pBox, pObj, i )
        pObj->TravId = p->nTravIds;
}